

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

void __thiscall
deqp::gls::StateChangeCallPerformanceCase::logTestCase(StateChangeCallPerformanceCase *this)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_328;
  MessageBuilder local_198;
  TestLog *local_18;
  TestLog *log;
  StateChangeCallPerformanceCase *this_local;
  
  log = (TestLog *)this;
  local_18 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_198,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [18])"Iteration count: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_iterationCount);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  tcu::TestLog::operator<<(&local_328,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_328,(char (*) [27])"Per iteration call count: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_callCount);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_328);
  return;
}

Assistant:

void StateChangeCallPerformanceCase::logTestCase (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::Message << "Iteration count: " << m_iterationCount << TestLog::EndMessage;
	log << TestLog::Message << "Per iteration call count: " << m_callCount << TestLog::EndMessage;
}